

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_shader_info_log(NegativeTestContext *ctx)

{
  GLuint shader;
  GLuint shader_00;
  allocator<char> local_bd;
  GLsizei length [1];
  string local_b8;
  char infoLog [128];
  
  shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  length[0] = -1;
  infoLog[0x70] = '\0';
  infoLog[0x71] = '\0';
  infoLog[0x72] = '\0';
  infoLog[0x73] = '\0';
  infoLog[0x74] = '\0';
  infoLog[0x75] = '\0';
  infoLog[0x76] = '\0';
  infoLog[0x77] = '\0';
  infoLog[0x78] = '\0';
  infoLog[0x79] = '\0';
  infoLog[0x7a] = '\0';
  infoLog[0x7b] = '\0';
  infoLog[0x7c] = '\0';
  infoLog[0x7d] = '\0';
  infoLog[0x7e] = '\0';
  infoLog[0x7f] = '\0';
  infoLog[0x60] = '\0';
  infoLog[0x61] = '\0';
  infoLog[0x62] = '\0';
  infoLog[99] = '\0';
  infoLog[100] = '\0';
  infoLog[0x65] = '\0';
  infoLog[0x66] = '\0';
  infoLog[0x67] = '\0';
  infoLog[0x68] = '\0';
  infoLog[0x69] = '\0';
  infoLog[0x6a] = '\0';
  infoLog[0x6b] = '\0';
  infoLog[0x6c] = '\0';
  infoLog[0x6d] = '\0';
  infoLog[0x6e] = '\0';
  infoLog[0x6f] = '\0';
  infoLog[0x50] = '\0';
  infoLog[0x51] = '\0';
  infoLog[0x52] = '\0';
  infoLog[0x53] = '\0';
  infoLog[0x54] = '\0';
  infoLog[0x55] = '\0';
  infoLog[0x56] = '\0';
  infoLog[0x57] = '\0';
  infoLog[0x58] = '\0';
  infoLog[0x59] = '\0';
  infoLog[0x5a] = '\0';
  infoLog[0x5b] = '\0';
  infoLog[0x5c] = '\0';
  infoLog[0x5d] = '\0';
  infoLog[0x5e] = '\0';
  infoLog[0x5f] = '\0';
  infoLog[0x40] = '\0';
  infoLog[0x41] = '\0';
  infoLog[0x42] = '\0';
  infoLog[0x43] = '\0';
  infoLog[0x44] = '\0';
  infoLog[0x45] = '\0';
  infoLog[0x46] = '\0';
  infoLog[0x47] = '\0';
  infoLog[0x48] = '\0';
  infoLog[0x49] = '\0';
  infoLog[0x4a] = '\0';
  infoLog[0x4b] = '\0';
  infoLog[0x4c] = '\0';
  infoLog[0x4d] = '\0';
  infoLog[0x4e] = '\0';
  infoLog[0x4f] = '\0';
  infoLog[0x30] = '\0';
  infoLog[0x31] = '\0';
  infoLog[0x32] = '\0';
  infoLog[0x33] = '\0';
  infoLog[0x34] = '\0';
  infoLog[0x35] = '\0';
  infoLog[0x36] = '\0';
  infoLog[0x37] = '\0';
  infoLog[0x38] = '\0';
  infoLog[0x39] = '\0';
  infoLog[0x3a] = '\0';
  infoLog[0x3b] = '\0';
  infoLog[0x3c] = '\0';
  infoLog[0x3d] = '\0';
  infoLog[0x3e] = '\0';
  infoLog[0x3f] = '\0';
  infoLog[0x20] = '\0';
  infoLog[0x21] = '\0';
  infoLog[0x22] = '\0';
  infoLog[0x23] = '\0';
  infoLog[0x24] = '\0';
  infoLog[0x25] = '\0';
  infoLog[0x26] = '\0';
  infoLog[0x27] = '\0';
  infoLog[0x28] = '\0';
  infoLog[0x29] = '\0';
  infoLog[0x2a] = '\0';
  infoLog[0x2b] = '\0';
  infoLog[0x2c] = '\0';
  infoLog[0x2d] = '\0';
  infoLog[0x2e] = '\0';
  infoLog[0x2f] = '\0';
  infoLog[0x10] = '\0';
  infoLog[0x11] = '\0';
  infoLog[0x12] = '\0';
  infoLog[0x13] = '\0';
  infoLog[0x14] = '\0';
  infoLog[0x15] = '\0';
  infoLog[0x16] = '\0';
  infoLog[0x17] = '\0';
  infoLog[0x18] = '\0';
  infoLog[0x19] = '\0';
  infoLog[0x1a] = '\0';
  infoLog[0x1b] = '\0';
  infoLog[0x1c] = '\0';
  infoLog[0x1d] = '\0';
  infoLog[0x1e] = '\0';
  infoLog[0x1f] = '\0';
  infoLog[0] = '\0';
  infoLog[1] = '\0';
  infoLog[2] = '\0';
  infoLog[3] = '\0';
  infoLog[4] = '\0';
  infoLog[5] = '\0';
  infoLog[6] = '\0';
  infoLog[7] = '\0';
  infoLog[8] = '\0';
  infoLog[9] = '\0';
  infoLog[10] = '\0';
  infoLog[0xb] = '\0';
  infoLog[0xc] = '\0';
  infoLog[0xd] = '\0';
  infoLog[0xe] = '\0';
  infoLog[0xf] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.",&local_bd
            );
  NegativeTestContext::beginSection(ctx,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  glu::CallLogWrapper::glGetShaderInfoLog(&ctx->super_CallLogWrapper,0xffffffff,0x80,length,infoLog)
  ;
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "GL_INVALID_OPERATION is generated if shader is not a shader object.",&local_bd);
  NegativeTestContext::beginSection(ctx,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  glu::CallLogWrapper::glGetShaderInfoLog(&ctx->super_CallLogWrapper,shader_00,0x80,length,infoLog);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"GL_INVALID_VALUE is generated if maxLength is less than 0.",
             &local_bd);
  NegativeTestContext::beginSection(ctx,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  glu::CallLogWrapper::glGetShaderInfoLog(&ctx->super_CallLogWrapper,shader,-1,length,infoLog);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,shader_00);
  return;
}

Assistant:

void get_shader_info_log (NegativeTestContext& ctx)
{
	GLuint shader		= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint program		= ctx.glCreateProgram();
	GLsizei length[1]	= { -1 };
	char infoLog[128]	= { 0 };

	ctx.beginSection("GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.");
	ctx.glGetShaderInfoLog(-1, 128, &length[0], &infoLog[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not a shader object.");
	ctx.glGetShaderInfoLog(program, 128, &length[0], &infoLog[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if maxLength is less than 0.");
	ctx.glGetShaderInfoLog(shader, -1, &length[0], &infoLog[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteShader(shader);
	ctx.glDeleteProgram(program);
}